

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O2

bool __thiscall Trie::buildClue(Trie *this)

{
  undefined2 uVar1;
  iterator iVar2;
  mapped_type *pptVar3;
  _Base_ptr p_Var4;
  trie_node_t **__x;
  _Self __tmp;
  _Rb_tree_node_base *p_Var5;
  trie_node_t *ptVar6;
  trie_node_t *child;
  queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_> Queue;
  undefined2 local_9a;
  value_type local_98;
  _Rb_tree_node_base *local_90;
  trie_node_t *local_88;
  _Deque_base<trie_node_s_*,_std::allocator<trie_node_s_*>_> local_80;
  
  std::queue<trie_node_s*,std::deque<trie_node_s*,std::allocator<trie_node_s*>>>::
  queue<std::deque<trie_node_s*,std::allocator<trie_node_s*>>,void>
            ((queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_> *)
             &local_80);
  __x = &this->root;
  std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>::push_back
            ((deque<trie_node_s_*,_std::allocator<trie_node_s_*>_> *)&local_80,__x);
  do {
    do {
      if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
        std::_Deque_base<trie_node_s_*,_std::allocator<trie_node_s_*>_>::~_Deque_base(&local_80);
        return true;
      }
      ptVar6 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>::pop_front
                ((deque<trie_node_s_*,_std::allocator<trie_node_s_*>_> *)&local_80);
    } while ((ptVar6->nextMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
    p_Var5 = &(ptVar6->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_90 = p_Var5;
    local_88 = ptVar6;
    for (p_Var4 = (ptVar6->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var4 != p_Var5; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      local_98 = (value_type)p_Var4[1]._M_parent;
      if (local_98 != (value_type)0x0) {
        std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>::push_back
                  ((deque<trie_node_s_*,_std::allocator<trie_node_s_*>_> *)&local_80,&local_98);
        if (ptVar6 == *__x) {
          local_98->search_clue = *__x;
        }
        else {
          uVar1 = (undefined2)p_Var4[1]._M_color;
          do {
            ptVar6 = ptVar6->search_clue;
            if (ptVar6 == (trie_node_t *)0x0) {
              local_98->search_clue = *__x;
              p_Var5 = local_90;
              ptVar6 = local_88;
              goto LAB_00106c5d;
            }
            local_9a = uVar1;
            iVar2 = std::
                    _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_trie_node_s_*>,_std::_Select1st<std::pair<const_unsigned_short,_trie_node_s_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                    ::find(&(ptVar6->nextMap)._M_t,&local_9a);
          } while ((_Rb_tree_header *)iVar2._M_node ==
                   &(ptVar6->nextMap)._M_t._M_impl.super__Rb_tree_header);
          local_9a = uVar1;
          pptVar3 = std::
                    map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                    ::operator[](&ptVar6->nextMap,&local_9a);
          local_98->search_clue = *pptVar3;
          p_Var5 = local_90;
          ptVar6 = local_88;
        }
      }
LAB_00106c5d:
    }
  } while( true );
}

Assistant:

bool Trie::buildClue()
{
	queue<trie_node_t*> Queue;
	auto iter = root->nextMap.begin();
	int i, head = 0, tail = 0;
	trie_node_t *clue = root, *out, *child;
	Queue.push(root);
	while ( ! Queue.empty() ) {
		out = Queue.front();
		Queue.pop();
		if (out->nextMap.empty()) {
			continue;
		}
		for (iter = out->nextMap.begin(); iter != out->nextMap.end(); iter++) {
			child = iter->second;
			if (child != NULL) {
				Queue.push(child);
				if (out == root) {
					child->search_clue = root;
					continue;
				}
				clue = out->search_clue;
				i = iter->first;
				while (clue) {
					if (clue->nextMap.find(i) != clue->nextMap.end()) {
						child->search_clue = clue->nextMap[i];
						break;
					}
					clue = clue->search_clue;
				}
				if (clue == NULL) {
					child->search_clue = root;
				}
			}
		}
	}
	return true;
}